

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

_Bool mpack_writer_ensure(mpack_writer_t *writer,size_t count)

{
  mpack_error_t mVar1;
  size_t sVar2;
  size_t count_local;
  mpack_writer_t *writer_local;
  
  mpack_writer_buffer_left(writer);
  mVar1 = mpack_writer_error(writer);
  if (mVar1 == mpack_ok) {
    if (writer->flush == (mpack_writer_flush_t)0x0) {
      mpack_writer_flag_error(writer,mpack_error_too_big);
      writer_local._7_1_ = false;
    }
    else {
      mpack_writer_flush_unchecked(writer);
      mVar1 = mpack_writer_error(writer);
      if (mVar1 == mpack_ok) {
        sVar2 = mpack_writer_buffer_left(writer);
        if (sVar2 < count) {
          mpack_writer_flag_error(writer,mpack_error_io);
          writer_local._7_1_ = false;
        }
        else {
          writer_local._7_1_ = true;
        }
      }
      else {
        writer_local._7_1_ = false;
      }
    }
  }
  else {
    writer_local._7_1_ = false;
  }
  return writer_local._7_1_;
}

Assistant:

MPACK_NOINLINE static bool mpack_writer_ensure(mpack_writer_t* writer, size_t count) {
    mpack_assert(count != 0, "cannot ensure zero bytes!");
    mpack_assert(count <= MPACK_WRITER_MINIMUM_BUFFER_SIZE,
            "cannot ensure %i bytes, this is more than the minimum buffer size %i!",
            (int)count, (int)MPACK_WRITER_MINIMUM_BUFFER_SIZE);
    mpack_assert(count > mpack_writer_buffer_left(writer),
            "request to ensure %i bytes but there are already %i left in the buffer!",
            (int)count, (int)mpack_writer_buffer_left(writer));

    mpack_log("ensuring %i bytes, %i left\n", (int)count, (int)mpack_writer_buffer_left(writer));

    if (mpack_writer_error(writer) != mpack_ok)
        return false;

    if (writer->flush == NULL) {
        mpack_writer_flag_error(writer, mpack_error_too_big);
        return false;
    }

    mpack_writer_flush_unchecked(writer);
    if (mpack_writer_error(writer) != mpack_ok)
        return false;

    if (mpack_writer_buffer_left(writer) >= count)
        return true;

    mpack_writer_flag_error(writer, mpack_error_io);
    return false;
}